

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp.hh
# Opt level: O0

void __thiscall
helix::nasdaq::moldudp_session<helix::nasdaq::nordic_itch_handler>::register_callback
          (moldudp_session<helix::nasdaq::nordic_itch_handler> *this,event_callback *callback)

{
  nordic_itch_handler *this_00;
  long in_RDI;
  event_callback *in_stack_ffffffffffffffa8;
  function<void_(const_helix::event_&)> *in_stack_ffffffffffffffc0;
  function<void_(const_helix::event_&)> local_30;
  
  this_00 = (nordic_itch_handler *)(in_RDI + 0x10);
  std::function<void_(const_helix::event_&)>::function(in_stack_ffffffffffffffc0,&local_30);
  nordic_itch_handler::register_callback(this_00,in_stack_ffffffffffffffa8);
  std::function<void_(const_helix::event_&)>::~function
            ((function<void_(const_helix::event_&)> *)0x146e96);
  return;
}

Assistant:

void moldudp_session<Handler>::register_callback(event_callback callback)
{
    _handler.register_callback(callback);
}